

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

attr_list INT_EVdfg_get_attr_list(EVdfg_stone stone)

{
  EVdfg p_Var1;
  EVdfg_configuration config;
  EVdfg_stone_state p_Var2;
  
  p_Var1 = stone->dfg;
  config = p_Var1->deployed_state;
  if ((((config != (EVdfg_configuration)0x0) &&
       (p_Var2 = find_stone_state(stone->stone_id,config), p_Var2 != (EVdfg_stone_state)0x0)) ||
      ((p_Var1->working_state != (EVdfg_configuration)0x0 &&
       (p_Var2 = find_stone_state(stone->stone_id,config), p_Var2 != (EVdfg_stone_state)0x0)))) &&
     (p_Var2->attrs != (attr_list)0x0)) {
    add_ref_attr_list();
    return p_Var2->attrs;
  }
  return (attr_list)0x0;
}

Assistant:

extern attr_list
INT_EVdfg_get_attr_list(EVdfg_stone stone)
{
    if (stone->dfg->deployed_state) {
	EVdfg_stone_state dstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (dstone) {
	    if (dstone->attrs) add_ref_attr_list(dstone->attrs);
	    return dstone->attrs;
	}
    }
    if (stone->dfg->working_state) {
	EVdfg_stone_state wstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (wstone) {
	    if (wstone->attrs) add_ref_attr_list(wstone->attrs);
	    return wstone->attrs;
	}
    }	
    return NULL;
}